

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O1

bool __thiscall CDBWrapper::ExistsImpl(CDBWrapper *this,Span<const_std::byte> key)

{
  DB *pDVar1;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  Status status;
  Slice slKey;
  string strValue;
  char *in_stack_ffffffffffffff80;
  Status in_stack_ffffffffffffff88;
  byte *local_70;
  size_t local_68;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  long local_20;
  
  local_68 = key.m_size;
  local_70 = key.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  puVar2 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar1 = ((puVar2->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  puVar2 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (*pDVar1->_vptr_DB[5])
            (&stack0xffffffffffffff88,pDVar1,
             &((puVar2->_M_t).
               super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
               super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
               super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->readoptions,&local_70,
             &local_40);
  bVar3 = true;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_ffffffffffffff88.state_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (in_stack_ffffffffffffff88.state_[4] == '\x01') {
      bVar3 = false;
    }
    else {
      leveldb::Status::ToString_abi_cxx11_(&local_60,(Status *)&stack0xffffffffffffff88);
      logging_function._M_str = "ExistsImpl";
      logging_function._M_len = 10;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file._M_len = 0x56;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x169,
                 IPC|COINDB|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ZMQ|BENCH|HTTP|TOR,
                 (Level)&local_60,in_stack_ffffffffffffff80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff88.state_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      HandleError((Status *)&stack0xffffffffffffff88);
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      in_stack_ffffffffffffff88.state_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(in_stack_ffffffffffffff88.state_);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::ExistsImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());

    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return false;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return true;
}